

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZGeoMesh *this;
  long lVar1;
  TPZCompEl **ppTVar2;
  TPZCompEl *this_00;
  TPZGeoEl *this_01;
  TPZGeoEl *pTVar3;
  long lVar4;
  TPZCompEl *pTVar5;
  long *plVar6;
  long lVar7;
  int64_t el;
  long nelem;
  TPZGeoEl *gelF;
  long lVar8;
  TPZStack<TPZCompElSide,_10> celstack;
  
  this = MFMesh->fReference;
  TPZGeoMesh::ResetReference(this);
  lVar8 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  lVar7 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar7;
  }
  lVar1 = cmeshVec->fNElements;
  if (cmeshVec->fNElements < 1) {
    lVar1 = lVar7;
  }
  do {
    if (lVar7 == lVar1) {
      for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
        pTVar5 = TPZCompMesh::Element(MFMesh,lVar7);
        if ((pTVar5 != (TPZCompEl *)0x0) &&
           (plVar6 = (long *)__dynamic_cast(pTVar5,&TPZCompEl::typeinfo,
                                            &TPZMultiphysicsElement::typeinfo,0),
           plVar6 != (long *)0x0)) {
          (**(code **)(*plVar6 + 0x220))(plVar6);
        }
      }
      return;
    }
    TPZCompMesh::LoadReferences(cmeshVec->fStore[lVar7]);
    for (nelem = 0; nelem != lVar8; nelem = nelem + 1) {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar5 = *ppTVar2;
      if (pTVar5 == (TPZCompEl *)0x0) {
LAB_011f829d:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x5e);
      }
      this_00 = (TPZCompEl *)
                __dynamic_cast(pTVar5,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
      if (this_00 == (TPZCompEl *)0x0) {
        lVar4 = __dynamic_cast(pTVar5,&TPZCompEl::typeinfo,
                               &TPZMultiphysicsInterfaceElement::typeinfo,0);
        if (lVar4 == 0) goto LAB_011f829d;
      }
      else {
        this_01 = TPZCompEl::Reference(this_00);
        TPZStack<TPZCompElSide,_10>::TPZStack(&celstack);
        (**(code **)(*(long *)this_01 + 0xf0))(this_01);
        if (this_01->fReference == (TPZCompEl *)0x0) {
          do {
            pTVar3 = TPZGeoEl::Father(this_01);
            if (pTVar3 == (TPZGeoEl *)0x0) {
              (**(code **)(*(long *)this_00 + 0x248))(this_00,0,lVar7);
              goto LAB_011f82c1;
            }
            this_01 = TPZGeoEl::Father(this_01);
          } while (this_01->fReference == (TPZCompEl *)0x0);
          (**(code **)(*(long *)this_00 + 0x248))(this_00,this_01->fReference,lVar7);
        }
        else {
          (**(code **)(*(long *)this_00 + 0x248))(this_00,this_01->fReference,lVar7);
        }
LAB_011f82c1:
        TPZManVector<TPZCompElSide,_10>::~TPZManVector
                  (&celstack.super_TPZManVector<TPZCompElSide,_10>);
      }
    }
    TPZGeoMesh::ResetReference(this);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
	TPZGeoMesh *gmesh = MFMesh->Reference();
	gmesh->ResetReference();
	int64_t nMFEl = MFMesh->NElements();
	int64_t nmesh = cmeshVec.size();
	int64_t imesh;
	for(imesh = 0; imesh<nmesh; imesh++)
	{
		cmeshVec[imesh]->LoadReferences();
		int64_t iel;
		for(iel=0; iel<nMFEl; iel++)
		{
            TPZCompEl * cel = MFMesh->ElementVec()[iel];
			TPZMultiphysicsElement * mfcel = dynamic_cast<TPZMultiphysicsElement *> (cel);
            TPZMultiphysicsInterfaceElement * mfint = dynamic_cast<TPZMultiphysicsInterfaceElement *>(cel);
			if(mfcel)
			{
                int64_t found = 0;
                TPZGeoEl * gel = mfcel->Reference();
                TPZStack<TPZCompElSide> celstack;
                TPZGeoElSide gelside(gel,gel->NSides()-1);
                // if the geometric element has a reference, it is an obvious candidate
                if (gel->Reference()) {
                    mfcel->AddElement(gel->Reference(), imesh);
                    continue;
                }
                else
                {
                    TPZGeoEl *gelF = gel;
                    while(gelF->Father())
                    {
                        gelF = gelF->Father();
                        if (gelF->Reference()) {
#ifdef PZDEBUG
                            if (gelF->MaterialId() != gel->MaterialId()) {
                                DebugStop();
                            }
#endif
                            mfcel->AddElement(gelF->Reference(), imesh);
                            found = true;
                            break;
                        }
                    }
                }
                if (!found) {
                    mfcel->AddElement(0, imesh);
                }
            }
            else if (mfint) {
                //set up interface
            }
            else {
                DebugStop();
            }
		}
		gmesh->ResetReference();
	}
    for (int64_t el = 0; el < nMFEl; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->InitializeIntegrationRule();
    }
}